

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O2

bool __thiscall blcl::net::server_interface<MsgType>::start(server_interface<MsgType> *this)

{
  thread local_20;
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  
  wait_for_client_connection(this);
  local_18.this = this;
  std::thread::thread<blcl::net::server_interface<MsgType>::start()::_lambda()_1_,,void>
            (&local_20,&local_18);
  std::thread::operator=(&this->ctx_thread_,&local_20);
  std::thread::~thread(&local_20);
  std::operator<<((ostream *)&std::cout,"[INFO] Server started!\n");
  return true;
}

Assistant:

bool start() {
            try {
                wait_for_client_connection();
                ctx_thread_ = std::thread([this]() { context_.run(); });
            } catch (std::exception& e) {
                std::cerr << "[ERR] Exception: " << e.what() << "\n";
                return false;
            }

            std::cout << "[INFO] Server started!\n";
            return true;
        }